

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O2

bool __thiscall ON_Plane::CreateFromPoints(ON_Plane *this,ON_3dPoint *P,ON_3dPoint *Q,ON_3dPoint *R)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  ON_3dVector local_48;
  
  (this->origin).z = P->z;
  dVar1 = P->y;
  (this->origin).x = P->x;
  (this->origin).y = dVar1;
  bVar2 = ON_3dVector::PerpendicularTo(&this->zaxis,P,Q,R);
  ON_3dPoint::operator-(&local_48,Q,P);
  (this->xaxis).z = local_48.z;
  (this->xaxis).x = local_48.x;
  (this->xaxis).y = local_48.y;
  ON_3dVector::Unitize(&this->xaxis);
  ON_CrossProduct(&local_48,&this->zaxis,&this->xaxis);
  (this->yaxis).z = local_48.z;
  (this->yaxis).x = local_48.x;
  (this->yaxis).y = local_48.y;
  ON_3dVector::Unitize(&this->yaxis);
  bVar3 = ON_PlaneEquation::Create(&this->plane_equation,this->origin,this->zaxis);
  return bVar3 && bVar2;
}

Assistant:

bool ON_Plane::CreateFromPoints(
          const ON_3dPoint& P,  // point on the plane
          const ON_3dPoint& Q,  // point on the plane
          const ON_3dPoint& R   // point on the plane
          )
{
  origin = P;
  bool rc = zaxis.PerpendicularTo(P,Q,R);
  xaxis = Q - P;
  xaxis.Unitize();
  yaxis = ON_CrossProduct( zaxis, xaxis );
  yaxis.Unitize();

  if ( !plane_equation.Create(origin,zaxis) )
    rc = false;

  return rc;
}